

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O0

void HTS_Vocoder_postfilter_lsp(HTS_Vocoder *v,double *lsp,size_t m,double alpha,double beta)

{
  void *pvVar1;
  ulong in_RDX;
  double *in_RSI;
  long in_RDI;
  HTS_Vocoder *v_00;
  double dVar2;
  double in_XMM1_Qa;
  double d2;
  double d1;
  size_t i;
  double e2;
  double e1;
  size_t in_stack_ffffffffffffffb0;
  double in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  ulong m_00;
  double *in_stack_ffffffffffffffc8;
  HTS_Vocoder *in_stack_ffffffffffffffd0;
  
  if ((0.0 < in_XMM1_Qa) && (1 < in_RDX)) {
    if (*(ulong *)(in_RDI + 0xb8) < in_RDX) {
      if (*(long *)(in_RDI + 0xb0) != 0) {
        HTS_free((void *)0x21a881);
      }
      pvVar1 = HTS_calloc((size_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
      *(void **)(in_RDI + 0xb0) = pvVar1;
      *(ulong *)(in_RDI + 0xb8) = in_RDX;
    }
    v_00 = (HTS_Vocoder *)
           HTS_lsp2en(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffb8);
    for (m_00 = 0; m_00 <= in_RDX; m_00 = m_00 + 1) {
      if ((m_00 < 2) || (in_RDX <= m_00)) {
        *(double *)(*(long *)(in_RDI + 0xb0) + m_00 * 8) = in_RSI[m_00];
      }
      else {
        in_stack_ffffffffffffffb8 = in_XMM1_Qa * (in_RSI[m_00 + 1] - in_RSI[m_00]);
        dVar2 = in_XMM1_Qa * (in_RSI[m_00] - in_RSI[m_00 - 1]);
        *(double *)(*(long *)(in_RDI + 0xb0) + m_00 * 8) =
             in_RSI[m_00 - 1] + dVar2 +
             (dVar2 * dVar2 *
             ((in_RSI[m_00 + 1] - in_RSI[m_00 - 1]) - (in_stack_ffffffffffffffb8 + dVar2))) /
             (dVar2 * dVar2 + in_stack_ffffffffffffffb8 * in_stack_ffffffffffffffb8);
      }
    }
    HTS_movem(*(double **)(in_RDI + 0xb0),in_RSI,(int)in_RDX + 1);
    dVar2 = HTS_lsp2en(v_00,in_stack_ffffffffffffffc8,m_00,in_stack_ffffffffffffffb8);
    if (((double)v_00 != dVar2) || (NAN((double)v_00) || NAN(dVar2))) {
      if (*(char *)(in_RDI + 0x18) == '\0') {
        dVar2 = sqrt((double)v_00 / dVar2);
        *in_RSI = dVar2 * *in_RSI;
      }
      else {
        dVar2 = log((double)v_00 / dVar2);
        *in_RSI = dVar2 * 0.5 + *in_RSI;
      }
    }
  }
  return;
}

Assistant:

static void HTS_Vocoder_postfilter_lsp(HTS_Vocoder * v, double *lsp, size_t m, double alpha, double beta)
{
   double e1, e2;
   size_t i;
   double d1, d2;

   if (beta > 0.0 && m > 1) {
      if (v->postfilter_size < m) {
         if (v->postfilter_buff != NULL)
            HTS_free(v->postfilter_buff);
         v->postfilter_buff = (double *) HTS_calloc(m + 1, sizeof(double));
         v->postfilter_size = m;
      }

      e1 = HTS_lsp2en(v, lsp, m, alpha);

      /* postfiltering */
      for (i = 0; i <= m; i++) {
         if (i > 1 && i < m) {
            d1 = beta * (lsp[i + 1] - lsp[i]);
            d2 = beta * (lsp[i] - lsp[i - 1]);
            v->postfilter_buff[i] = lsp[i - 1] + d2 + (d2 * d2 * ((lsp[i + 1] - lsp[i - 1]) - (d1 + d2))) / ((d2 * d2) + (d1 * d1));
         } else {
            v->postfilter_buff[i] = lsp[i];
         }
      }
      HTS_movem(v->postfilter_buff, lsp, m + 1);

      e2 = HTS_lsp2en(v, lsp, m, alpha);

      if (e1 != e2) {
         if (v->use_log_gain)
            lsp[0] += 0.5 * log(e1 / e2);
         else
            lsp[0] *= sqrt(e1 / e2);
      }
   }
}